

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Postprocess.cpp
# Opt level: O0

void __thiscall
Assimp::X3DImporter::Postprocess_BuildMaterial
          (X3DImporter *this,CX3DImporter_NodeElement *pNodeElement,aiMaterial **pMaterial)

{
  CX3DImporter_NodeElement *pCVar1;
  bool bVar2;
  DeadlyImportError *pDVar3;
  aiMaterial *this_00;
  reference ppCVar4;
  char *__s;
  CX3DImporter_NodeElement_TextureTransform *tnetextr;
  aiUVTransform trans;
  int mode;
  undefined1 local_4bc [8];
  aiString url_str;
  CX3DImporter_NodeElement_ImageTexture *tnetex;
  CX3DImporter_NodeElement_Material *tnemat;
  float tvalf;
  aiColor3D tcol3;
  _Self local_90;
  const_iterator el_it;
  aiMaterial *taimat;
  string local_78;
  undefined1 local_55;
  allocator<char> local_41;
  string local_40;
  aiMaterial **local_20;
  aiMaterial **pMaterial_local;
  CX3DImporter_NodeElement *pNodeElement_local;
  X3DImporter *this_local;
  
  local_20 = pMaterial;
  pMaterial_local = (aiMaterial **)pNodeElement;
  pNodeElement_local = (CX3DImporter_NodeElement *)this;
  if (pMaterial == (aiMaterial **)0x0) {
    local_55 = 1;
    pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Postprocess_BuildMaterial. pMaterial is nullptr.",&local_41);
    DeadlyImportError::DeadlyImportError(pDVar3,&local_40);
    local_55 = 0;
    __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  if (*pMaterial == (aiMaterial *)0x0) {
    this_00 = (aiMaterial *)operator_new(0x10);
    aiMaterial::aiMaterial(this_00);
    *local_20 = this_00;
    el_it._M_node = (_List_node_base *)*local_20;
    local_90._M_node =
         (_List_node_base *)
         std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
         ::begin((list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *)
                 (pMaterial_local + 7));
    while( true ) {
      tcol3._4_8_ = std::__cxx11::
                    list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
                    end((list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                         *)(pMaterial_local + 7));
      bVar2 = std::operator!=(&local_90,(_Self *)&tcol3.g);
      if (!bVar2) break;
      ppCVar4 = std::_List_const_iterator<CX3DImporter_NodeElement_*>::operator*(&local_90);
      if ((*ppCVar4)->Type == ENET_Material) {
        aiColor3D::aiColor3D((aiColor3D *)((long)&tnemat + 4));
        ppCVar4 = std::_List_const_iterator<CX3DImporter_NodeElement_*>::operator*(&local_90);
        pCVar1 = *ppCVar4;
        tnemat._4_4_ = *(undefined4 *)&pCVar1[1]._vptr_CX3DImporter_NodeElement;
        tvalf = *(float *)&pCVar1[1]._vptr_CX3DImporter_NodeElement;
        tcol3.r = *(ai_real *)&pCVar1[1]._vptr_CX3DImporter_NodeElement;
        aiMaterial::AddProperty
                  ((aiMaterial *)el_it._M_node,(aiColor3D *)((long)&tnemat + 4),1,"$clr.ambient",0,0
                  );
        aiMaterial::AddProperty
                  ((aiMaterial *)el_it._M_node,
                   (aiColor3D *)((long)&pCVar1[1]._vptr_CX3DImporter_NodeElement + 4),1,
                   "$clr.diffuse",0,0);
        aiMaterial::AddProperty
                  ((aiMaterial *)el_it._M_node,(aiColor3D *)&pCVar1[1].ID,1,"$clr.emissive",0,0);
        aiMaterial::AddProperty
                  ((aiMaterial *)el_it._M_node,(aiColor3D *)&pCVar1[1].ID.field_2,1,"$clr.specular",
                   0,0);
        tnemat._0_4_ = 1.0;
        aiMaterial::AddProperty
                  ((aiMaterial *)el_it._M_node,(float *)&tnemat,1,"$mat.shinpercent",0,0);
        aiMaterial::AddProperty
                  ((aiMaterial *)el_it._M_node,(float *)((long)&pCVar1[1].ID._M_string_length + 4),1
                   ,"$mat.shininess",0,0);
        tnemat._0_4_ = 1.0 - *(float *)((long)&pCVar1[1].ID.field_2 + 0xc);
        aiMaterial::AddProperty((aiMaterial *)el_it._M_node,(float *)&tnemat,1,"$mat.opacity",0,0);
      }
      else {
        ppCVar4 = std::_List_const_iterator<CX3DImporter_NodeElement_*>::operator*(&local_90);
        if ((*ppCVar4)->Type == ENET_ImageTexture) {
          ppCVar4 = std::_List_const_iterator<CX3DImporter_NodeElement_*>::operator*(&local_90);
          url_str.data._1016_8_ = *ppCVar4;
          __s = (char *)std::__cxx11::string::c_str();
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&mode,__s,(allocator<char> *)((long)&trans.mRotation + 3));
          aiString::aiString((aiString *)local_4bc,(string *)&mode);
          std::__cxx11::string::~string((string *)&mode);
          std::allocator<char>::~allocator((allocator<char> *)((long)&trans.mRotation + 3));
          trans.mScaling.y = 0.0;
          aiMaterial::AddProperty((aiMaterial *)el_it._M_node,(aiString *)local_4bc,"$tex.file",1,0)
          ;
          aiMaterial::AddProperty<bool>
                    ((aiMaterial *)el_it._M_node,(bool *)(url_str.data._1016_8_ + 0x50),1,
                     "$tex.mapmodeu",1,0);
          aiMaterial::AddProperty<bool>
                    ((aiMaterial *)el_it._M_node,(bool *)(url_str.data._1016_8_ + 0x51),1,
                     "$tex.mapmodev",1,0);
          aiMaterial::AddProperty
                    ((aiMaterial *)el_it._M_node,(int *)&trans.mScaling.y,1,"$tex.op",1,0);
        }
        else {
          ppCVar4 = std::_List_const_iterator<CX3DImporter_NodeElement_*>::operator*(&local_90);
          if ((*ppCVar4)->Type == ENET_TextureTransform) {
            aiUVTransform::aiUVTransform((aiUVTransform *)((long)&tnetextr + 4));
            ppCVar4 = std::_List_const_iterator<CX3DImporter_NodeElement_*>::operator*(&local_90);
            pCVar1 = *ppCVar4;
            register0x00001200 =
                 ::operator-((aiVector2t<float> *)&pCVar1[1].ID.field_0x4,
                             (aiVector2t<float> *)(pCVar1 + 1));
            trans.mTranslation = *(aiVector2D *)&pCVar1[1].field_0xc;
            trans.mScaling.x = (float)pCVar1[1].Type;
            aiMaterial::AddProperty
                      ((aiMaterial *)el_it._M_node,(aiUVTransform *)((long)&tnetextr + 4),1,
                       "$tex.uvtrafo",1,0);
          }
        }
      }
      std::_List_const_iterator<CX3DImporter_NodeElement_*>::operator++(&local_90);
    }
    return;
  }
  taimat._6_1_ = 1;
  pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"Postprocess_BuildMaterial. *pMaterial must be nullptr.",
             (allocator<char> *)((long)&taimat + 7));
  DeadlyImportError::DeadlyImportError(pDVar3,&local_78);
  taimat._6_1_ = 0;
  __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void X3DImporter::Postprocess_BuildMaterial(const CX3DImporter_NodeElement& pNodeElement, aiMaterial** pMaterial) const
{
	// check argument
	if(pMaterial == nullptr) throw DeadlyImportError("Postprocess_BuildMaterial. pMaterial is nullptr.");
	if(*pMaterial != nullptr) throw DeadlyImportError("Postprocess_BuildMaterial. *pMaterial must be nullptr.");

	*pMaterial = new aiMaterial;
	aiMaterial& taimat = **pMaterial;// creating alias for convenience.

	// at this point pNodeElement point to <Appearance> node. Walk through childs and add all stored data.
	for(std::list<CX3DImporter_NodeElement*>::const_iterator el_it = pNodeElement.Child.begin(); el_it != pNodeElement.Child.end(); ++el_it)
	{
		if((*el_it)->Type == CX3DImporter_NodeElement::ENET_Material)
		{
			aiColor3D tcol3;
			float tvalf;
			CX3DImporter_NodeElement_Material& tnemat = *((CX3DImporter_NodeElement_Material*)*el_it);

			tcol3.r = tnemat.AmbientIntensity, tcol3.g = tnemat.AmbientIntensity, tcol3.b = tnemat.AmbientIntensity;
			taimat.AddProperty(&tcol3, 1, AI_MATKEY_COLOR_AMBIENT);
			taimat.AddProperty(&tnemat.DiffuseColor, 1, AI_MATKEY_COLOR_DIFFUSE);
			taimat.AddProperty(&tnemat.EmissiveColor, 1, AI_MATKEY_COLOR_EMISSIVE);
			taimat.AddProperty(&tnemat.SpecularColor, 1, AI_MATKEY_COLOR_SPECULAR);
			tvalf = 1;
			taimat.AddProperty(&tvalf, 1, AI_MATKEY_SHININESS_STRENGTH);
			taimat.AddProperty(&tnemat.Shininess, 1, AI_MATKEY_SHININESS);
			tvalf = 1.0f - tnemat.Transparency;
			taimat.AddProperty(&tvalf, 1, AI_MATKEY_OPACITY);
		}// if((*el_it)->Type == CX3DImporter_NodeElement::ENET_Material)
		else if((*el_it)->Type == CX3DImporter_NodeElement::ENET_ImageTexture)
		{
			CX3DImporter_NodeElement_ImageTexture& tnetex = *((CX3DImporter_NodeElement_ImageTexture*)*el_it);
			aiString url_str(tnetex.URL.c_str());
			int mode = aiTextureOp_Multiply;

			taimat.AddProperty(&url_str, AI_MATKEY_TEXTURE_DIFFUSE(0));
			taimat.AddProperty(&tnetex.RepeatS, 1, AI_MATKEY_MAPPINGMODE_U_DIFFUSE(0));
			taimat.AddProperty(&tnetex.RepeatT, 1, AI_MATKEY_MAPPINGMODE_V_DIFFUSE(0));
			taimat.AddProperty(&mode, 1, AI_MATKEY_TEXOP_DIFFUSE(0));
		}// else if((*el_it)->Type == CX3DImporter_NodeElement::ENET_ImageTexture)
		else if((*el_it)->Type == CX3DImporter_NodeElement::ENET_TextureTransform)
		{
			aiUVTransform trans;
			CX3DImporter_NodeElement_TextureTransform& tnetextr = *((CX3DImporter_NodeElement_TextureTransform*)*el_it);

			trans.mTranslation = tnetextr.Translation - tnetextr.Center;
			trans.mScaling = tnetextr.Scale;
			trans.mRotation = tnetextr.Rotation;
			taimat.AddProperty(&trans, 1, AI_MATKEY_UVTRANSFORM_DIFFUSE(0));
		}// else if((*el_it)->Type == CX3DImporter_NodeElement::ENET_TextureTransform)
	}// for(std::list<CX3DImporter_NodeElement*>::const_iterator el_it = pNodeElement.Child.begin(); el_it != pNodeElement.Child.end(); el_it++)
}